

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O3

void __thiscall
OpenMD::MolecularRestraint::setReferenceStructure
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *ref,
          Vector3d *refCom)

{
  Vector3d *pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  uint i;
  long lVar4;
  pointer pVVar5;
  Vector<double,_3U> result;
  double local_28 [3];
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
            (&this->ref_,ref);
  pVVar1 = &this->refCom_;
  if (pVVar1 != refCom) {
    lVar4 = 0;
    do {
      (pVVar1->super_Vector<double,_3U>).data_[lVar4] =
           (refCom->super_Vector<double,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  pVVar3 = (this->ref_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = (this->ref_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (pVVar5 = pVVar2; pVVar5 != pVVar3; pVVar5 = pVVar5 + 1) {
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    lVar4 = 0;
    do {
      local_28[lVar4] =
           (pVVar5->super_Vector<double,_3U>).data_[lVar4] -
           (pVVar1->super_Vector<double,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    (pVVar5->super_Vector<double,_3U>).data_[2] = local_28[2];
    (pVVar5->super_Vector<double,_3U>).data_[0] = local_28[0];
    (pVVar5->super_Vector<double,_3U>).data_[1] = local_28[1];
  }
  pVVar5 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->forces_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar5) {
    (this->forces_).
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar5;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->forces_,((long)pVVar3 - (long)pVVar2 >> 3) * -0x5555555555555555);
  return;
}

Assistant:

void setReferenceStructure(std::vector<Vector3d> ref, Vector3d refCom) {
      ref_    = ref;
      refCom_ = refCom;

      std::vector<Vector3d>::iterator i;

      for (i = ref_.begin(); i != ref_.end(); ++i) {
        (*i) = (*i) - refCom_;
      }

      forces_.clear();
      forces_.resize(ref_.size());
    }